

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O1

astcenc_profile astcEncoderProfile(ktxAstcParams *params,uint32_t *bdb)

{
  byte bVar1;
  ktx_uint32_t kVar2;
  astcenc_profile aVar3;
  
  bVar1 = *(byte *)((long)bdb + 10);
  if (1 < bVar1 - 1) {
    __assert_fail("transfer == KHR_DF_TRANSFER_LINEAR && \"Unsupported transfer function, only support sRGB and Linear\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x181,
                  "astcenc_profile astcEncoderProfile(const ktxAstcParams &, const uint32_t *)");
  }
  kVar2 = params->mode;
  aVar3 = ASTCENC_PRF_LDR_SRGB;
  if (kVar2 != 1 || bVar1 != 2) {
    if (bVar1 == 2) {
      if (kVar2 != 1) {
        __assert_fail("ldr && \"HDR sRGB profile not supported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                      ,0x16a,"astcenc_profile astcProfile(bool, bool)");
      }
    }
    else {
      aVar3 = (uint)(kVar2 != 1) * 2 + ASTCENC_PRF_LDR;
    }
  }
  return aVar3;
}

Assistant:

static astcenc_profile
astcEncoderProfile(const ktxAstcParams &params, const uint32_t* bdb) {

    ktx_uint32_t transfer = KHR_DFDVAL(bdb, TRANSFER);

    bool sRGB = transfer == KHR_DF_TRANSFER_SRGB;
    bool ldr = params.mode == KTX_PACK_ASTC_ENCODER_MODE_LDR;

    if (!sRGB) {
        assert(transfer == KHR_DF_TRANSFER_LINEAR && "Unsupported transfer function, only support sRGB and Linear");
    }

    return astcProfile(sRGB, ldr);
}